

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void google::anon_unknown_0::DemangleInplace(char *out,size_t out_size)

{
  bool bVar1;
  size_t sVar2;
  size_t len;
  char demangled [256];
  size_t out_size_local;
  char *out_local;
  
  demangled._248_8_ = out_size;
  bVar1 = Demangle(out,(char *)&len,0x100);
  if ((bVar1) && (sVar2 = strlen((char *)&len), sVar2 + 1 <= (ulong)demangled._248_8_)) {
    if (0xff < sVar2) {
      abort();
    }
    memmove(out,&len,sVar2 + 1);
  }
  return;
}

Assistant:

ATTRIBUTE_NOINLINE
void DemangleInplace(char* out, size_t out_size) {
  char demangled[256];  // Big enough for sane demangled symbols.
  if (Demangle(out, demangled, sizeof(demangled))) {
    // Demangling succeeded. Copy to out if the space allows.
    size_t len = strlen(demangled);
    if (len + 1 <= out_size) {  // +1 for '\0'.
      GLOG_SAFE_ASSERT(len < sizeof(demangled));
      memmove(out, demangled, len + 1);
    }
  }
}